

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl> *this,
          void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  
  if ((pointer != (void *)0x0) && (lVar1 = *(long *)((long)pointer + 8), lVar1 != 0)) {
    uVar2 = *(undefined8 *)((long)pointer + 0x10);
    *(undefined8 *)((long)pointer + 8) = 0;
    *(undefined8 *)((long)pointer + 0x10) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x18))
              (*(undefined8 **)((long)pointer + 0x18),lVar1,1,uVar2,uVar2,0);
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }